

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O2

JDIMENSION jpeg_read_raw_data(j_decompress_ptr cinfo,JSAMPIMAGE data,JDIMENSION max_lines)

{
  jpeg_error_mgr *pjVar1;
  jpeg_progress_mgr *pjVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = cinfo->global_state;
  if (iVar3 != 0xce) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x14;
    (pjVar1->msg_parm).i[0] = iVar3;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar4 = cinfo->output_height;
  if (cinfo->output_scanline < uVar4) {
    pjVar2 = cinfo->progress;
    if (pjVar2 != (jpeg_progress_mgr *)0x0) {
      pjVar2->pass_counter = (ulong)cinfo->output_scanline;
      pjVar2->pass_limit = (ulong)uVar4;
      (*pjVar2->progress_monitor)((j_common_ptr)cinfo);
    }
    uVar4 = cinfo->min_DCT_scaled_size * cinfo->max_v_samp_factor;
    if (max_lines < uVar4) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x17;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    iVar3 = (*cinfo->coef->decompress_data)(cinfo,data);
    if (iVar3 != 0) {
      cinfo->output_scanline = cinfo->output_scanline + uVar4;
      return uVar4;
    }
  }
  else {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x7b;
    (*pjVar1->emit_message)((j_common_ptr)cinfo,-1);
  }
  return 0;
}

Assistant:

GLOBAL(JDIMENSION)
jpeg_read_raw_data(j_decompress_ptr cinfo, JSAMPIMAGE data,
                   JDIMENSION max_lines)
{
  JDIMENSION lines_per_iMCU_row;

  if (cinfo->global_state != DSTATE_RAW_OK)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  if (cinfo->output_scanline >= cinfo->output_height) {
    WARNMS(cinfo, JWRN_TOO_MUCH_DATA);
    return 0;
  }

  /* Call progress monitor hook if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->pass_counter = (long)cinfo->output_scanline;
    cinfo->progress->pass_limit = (long)cinfo->output_height;
    (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
  }

  /* Verify that at least one iMCU row can be returned. */
  lines_per_iMCU_row = cinfo->max_v_samp_factor * cinfo->_min_DCT_scaled_size;
  if (max_lines < lines_per_iMCU_row)
    ERREXIT(cinfo, JERR_BUFFER_SIZE);

  /* Decompress directly into user's buffer. */
  if (!(*cinfo->coef->decompress_data) (cinfo, data))
    return 0;                   /* suspension forced, can do nothing more */

  /* OK, we processed one iMCU row. */
  cinfo->output_scanline += lines_per_iMCU_row;
  return lines_per_iMCU_row;
}